

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O1

MPP_RET process_slice(H264_SLICE_t *currSlice)

{
  RecoveryPoint *pRVar1;
  bitread_ctx_t *bitctx;
  H264NalRefIdcType HVar2;
  int iVar3;
  RK_U32 RVar4;
  int iVar5;
  h264d_cur_ctx_t *phVar6;
  h264d_video_ctx_t *phVar7;
  H264dVideoCtx_t *p_Vid;
  h264_dec_ctx_t *phVar8;
  h264_pps_t *phVar9;
  RK_S64 RVar10;
  MPP_RET MVar11;
  int iVar12;
  h264_subsps_t *phVar13;
  uint uVar14;
  ulong uVar15;
  RK_S32 RVar16;
  char *pcVar17;
  h264_subsps_t *subset_sps;
  undefined8 uVar18;
  uint uVar19;
  h264_pps_t *phVar20;
  h264_subsps_t *sps;
  bool bVar21;
  RK_U32 _out;
  H264dVideoCtx_t *local_40;
  H264_PPS_t *local_38;
  
  phVar6 = currSlice->p_Cur;
  phVar7 = currSlice->p_Vid;
  bitctx = &phVar6->bitctx;
  currSlice->p_Dpb_layer[0] = phVar7->p_Dpb_layer[0];
  currSlice->p_Dpb_layer[1] = phVar7->p_Dpb_layer[1];
  MVar11 = mpp_read_ue(bitctx,&_out);
  (phVar6->bitctx).ret = MVar11;
  if (MVar11 != MPP_OK) goto LAB_0018db51;
  currSlice->start_mb_nr = _out;
  MVar11 = mpp_read_ue(bitctx,&_out);
  (phVar6->bitctx).ret = MVar11;
  if (MVar11 != MPP_OK) goto LAB_0018db51;
  uVar14 = _out % 5;
  currSlice->slice_type = uVar14;
  phVar7->slice_type = uVar14;
  if (uVar14 - 3 < 2) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_ERR_UNKNOW;
    }
    _mpp_log_l(4,"h264d_slice","sp or si slice not support\n",(char *)0x0);
    return MPP_ERR_UNKNOW;
  }
  MVar11 = mpp_read_ue(bitctx,&_out);
  (phVar6->bitctx).ret = MVar11;
  if (MVar11 != MPP_OK) goto LAB_0018db51;
  currSlice->pic_parameter_set_id = _out;
  p_Vid = currSlice->p_Vid;
  uVar14 = (uint)((currSlice->p_Cur->nalu).nalu_type == H264_NALU_TYPE_IDR);
  currSlice->idr_flag = uVar14;
  HVar2 = (currSlice->p_Cur->nalu).nal_reference_idc;
  currSlice->nal_reference_idc = HVar2;
  phVar8 = p_Vid->p_Dec;
  (phVar8->errctx).used_ref_flag = (uint)(HVar2 != H264_NALU_PRIORITY_DISPOSABLE);
  if (currSlice->slice_type == 2) {
    (phVar8->errctx).dpb_err_flag = 0;
  }
  if ((currSlice->svc_extension_flag == 0) || ((currSlice->mvcExt).iPrefixNALU != 0)) {
    uVar14 = (currSlice->mvcExt).anchor_pic_flag;
    currSlice->view_id = (currSlice->mvcExt).view_id;
    currSlice->inter_view_flag = (currSlice->mvcExt).inter_view_flag;
LAB_0018dc3e:
    currSlice->anchor_pic_flag = uVar14;
  }
  else if (currSlice->svc_extension_flag == -1) {
    if ((currSlice->mvcExt).valid == 0) {
      RVar16 = 0;
    }
    else {
      RVar16 = *p_Vid->active_subsps->view_id;
    }
    currSlice->view_id = RVar16;
    currSlice->inter_view_flag = 1;
    goto LAB_0018dc3e;
  }
  iVar3 = currSlice->view_id;
  currSlice->layer_id = iVar3;
  if (-1 < (long)iVar3) {
    currSlice->p_Dpb = p_Vid->p_Dpb_layer[iVar3];
  }
  if (((ulong)currSlice->pic_parameter_set_id < 0x100) &&
     (phVar9 = p_Vid->ppsSet[currSlice->pic_parameter_set_id], phVar9 != (h264_pps_t *)0x0)) {
    phVar20 = (h264_pps_t *)0x0;
    if (phVar9->Valid != 0) {
      phVar20 = phVar9;
    }
  }
  else {
    phVar20 = (h264_pps_t *)0x0;
  }
  if (phVar20 == (h264_pps_t *)0x0) {
    MVar11 = MPP_ERR_VALUE;
    if (((byte)h264d_debug & 4) != 0) {
      pcVar17 = "value error(%d).\n";
      uVar18 = 0x167;
      goto LAB_0018dfc5;
    }
  }
  else {
    if ((currSlice->mvcExt).valid == 0) {
      p_Vid->active_mvc_sps_flag = 0;
      uVar15 = (ulong)phVar20->seq_parameter_set_id;
LAB_0018dd49:
      phVar13 = (h264_subsps_t *)0x0;
      sps = (h264_subsps_t *)p_Vid->spsSet[uVar15];
    }
    else {
      uVar15 = (ulong)phVar20->seq_parameter_set_id;
      phVar13 = p_Vid->subspsSet[uVar15];
      if (((phVar13 == (h264_subsps_t *)0x0) || (phVar13->Valid == 0)) ||
         (phVar13->num_views_minus1 < 1)) {
LAB_0018dcd0:
        p_Vid->active_mvc_sps_flag = 0;
        goto LAB_0018dd49;
      }
      RVar4 = (currSlice->mvcExt).view_id;
      if (RVar4 == *phVar13->view_id) goto LAB_0018dcd0;
      sps = phVar13;
      if (RVar4 == phVar13->view_id[1]) {
        p_Vid->active_mvc_sps_flag = 1;
      }
    }
    if (p_Vid->active_mvc_sps_flag == 0) {
      if (sps == (h264_subsps_t *)0x0) {
        subset_sps = (H264_subSPS_t *)0x0;
        sps = (h264_subsps_t *)0x0;
      }
      else {
        subset_sps = (h264_subsps_t *)0x0;
        if ((sps->sps).Valid == 0) {
          sps = subset_sps;
        }
      }
    }
    else {
      subset_sps = (h264_subsps_t *)0x0;
      if ((phVar13 != (h264_subsps_t *)0x0) && (phVar13->Valid != 0)) {
        subset_sps = phVar13;
      }
      sps = subset_sps;
      if (subset_sps == (h264_subsps_t *)0x0) {
        MVar11 = MPP_ERR_VALUE;
        if (((byte)h264d_debug & 4) != 0) {
          pcVar17 = "value error(%d).\n";
          uVar18 = 0x182;
          goto LAB_0018dfc5;
        }
        goto LAB_0018dfcc;
      }
    }
    if (sps == (h264_subsps_t *)0x0) {
      MVar11 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) != 0) {
        pcVar17 = "value error(%d).\n";
        uVar18 = 0x188;
        goto LAB_0018dfc5;
      }
    }
    else {
      uVar14 = (sps->sps).seq_parameter_set_id;
      if ((((uVar14 < 0x20) && ((sps->sps).separate_colour_plane_flag != 1)) &&
          (((sps->sps).chroma_format_idc < 3 &&
           (((((iVar3 = (sps->sps).bit_depth_luma_minus8, iVar3 < 3 &&
               ((sps->sps).bit_depth_chroma_minus8 < 3)) &&
              ((sps->sps).log2_max_frame_num_minus4 < 0xd)) &&
             (((sps->sps).pic_order_cnt_type < 3 &&
              ((sps->sps).log2_max_pic_order_cnt_lsb_minus4 < 0xd)))) &&
            ((sps->sps).num_ref_frames_in_pic_order_cnt_cycle < 0x100)))))) &&
         (((sps->sps).max_num_ref_frames < 0x11 &&
          ((sps->sps).qpprime_y_zero_transform_bypass_flag != 1)))) {
        if (phVar8->hw_info == (MppDecHwCap *)0x0) {
          iVar12 = 0x77;
        }
        else {
          uVar19 = (uint)*(undefined8 *)&phVar8->hw_info->field_0x4;
          if ((uVar19 >> 0xd & 1) == 0) {
            iVar12 = 0xff;
            if ((uVar19 >> 0xc & 1) == 0) {
              iVar12 = 0x77;
            }
          }
          else {
            iVar12 = (uVar19 >> 0x15 & 7) * 0x1ff;
          }
        }
        iVar5 = (sps->sps).pic_width_in_mbs_minus1;
        if (iVar5 < 3) {
          if (((byte)h264d_debug & 1) != 0) {
            uVar19 = iVar5 * 0x10 + 0x10;
            pcVar17 = "sps %d too small width %d\n";
LAB_0018df92:
            _mpp_log_l(4,"h264d_slice",pcVar17,(char *)0x0,(ulong)uVar14,(ulong)uVar19);
          }
        }
        else if (iVar12 < iVar5) {
          if (((byte)h264d_debug & 1) != 0) {
            uVar14 = iVar5 * 0x10 + 0x10;
            uVar19 = iVar12 << 4;
            pcVar17 = "width %d is larger than soc max support %d\n";
            goto LAB_0018df92;
          }
        }
        else {
          if (subset_sps != (H264_subSPS_t *)0x0) {
            bVar21 = subset_sps->num_views_minus1 != 1;
            if (0 < *subset_sps->num_anchor_refs_l0) {
              bVar21 = **subset_sps->anchor_ref_l0 != *subset_sps->view_id ||
                       subset_sps->num_views_minus1 != 1;
            }
            if (0 < *subset_sps->num_anchor_refs_l1) {
              bVar21 = (bool)(bVar21 | **subset_sps->anchor_ref_l1 != subset_sps->view_id[1]);
            }
            if (0 < *subset_sps->num_non_anchor_refs_l0) {
              bVar21 = (bool)(bVar21 | **subset_sps->non_anchor_ref_l0 != *subset_sps->view_id);
            }
            if (0 < *subset_sps->num_non_anchor_refs_l1) {
              bVar21 = (bool)(bVar21 | **subset_sps->non_anchor_ref_l1 != subset_sps->view_id[1]);
            }
            if (bVar21) {
              if (((byte)h264d_debug & 1) != 0) {
                pcVar17 = "subsps has error, sps_id=%d";
                goto LAB_0018dee0;
              }
              goto LAB_0018df99;
            }
          }
          uVar19 = phVar20->pic_parameter_set_id;
          if (((((phVar20->redundant_pic_cnt_present_flag != 1) && (uVar19 < 0x100)) &&
               (phVar20->seq_parameter_set_id < 0x20)) &&
              (((phVar20->num_slice_groups_minus1 < 1 &&
                (phVar20->num_ref_idx_l0_default_active_minus1 < 0x20)) &&
               ((phVar20->num_ref_idx_l1_default_active_minus1 < 0x20 &&
                ((phVar20->pic_init_qp_minus26 < 0x1a &&
                 (iVar3 * -6 + -0x1a <= phVar20->pic_init_qp_minus26)))))))) &&
             ((0xffffffcb < phVar20->pic_init_qs_minus26 - 0x1aU &&
              (0xffffffe6 < phVar20->chroma_qp_index_offset - 0xdU)))) {
            local_40 = p_Vid;
            local_38 = phVar20;
            MVar11 = activate_sps(p_Vid,&sps->sps,subset_sps);
            if (MVar11 < MPP_OK) {
              if (((byte)h264d_debug & 4) != 0) {
                pcVar17 = "Function error(%d).\n";
                uVar18 = 0x18b;
                goto LAB_0018dfc5;
              }
            }
            else {
              MVar11 = activate_pps(local_40,local_38);
              if (MVar11 < MPP_OK) {
                if (((byte)h264d_debug & 4) != 0) {
                  pcVar17 = "Function error(%d).\n";
                  uVar18 = 0x18c;
                  goto LAB_0018dfc5;
                }
              }
              else {
                RVar4 = (sps->sps).seq_parameter_set_id;
                if ((local_40->last_sps_id != RVar4) ||
                   (local_40->last_pps_id != local_38->pic_parameter_set_id)) {
                  local_40->last_sps_id = RVar4;
                  local_40->last_pps_id = local_38->pic_parameter_set_id;
                  local_40->spspps_update = 1;
                }
                if (local_40->p_Dec->mvc_valid != '\0') {
                  phVar13 = local_40->subspsSet[local_38->seq_parameter_set_id];
                  if ((phVar13 == (h264_subsps_t *)0x0) || (phVar13->Valid == 0)) {
                    phVar13 = (h264_subsps_t *)0x0;
                  }
                  local_40->active_subsps = phVar13;
                }
                currSlice->active_sps = local_40->active_sps;
                currSlice->active_pps = local_40->active_pps;
                local_40->type = currSlice->slice_type;
                MVar11 = MPP_OK;
              }
            }
            goto LAB_0018dfcc;
          }
          if (((byte)h264d_debug & 1) != 0) {
            pcVar17 = "pps has error, sps_id=%d, pps_id";
            goto LAB_0018df92;
          }
        }
      }
      else if (((byte)h264d_debug & 1) != 0) {
        pcVar17 = "sps has error, sps_id=%d";
LAB_0018dee0:
        _mpp_log_l(4,"h264d_slice",pcVar17,(char *)0x0);
      }
LAB_0018df99:
      MVar11 = MPP_ERR_VALUE;
      if (((byte)h264d_debug & 4) != 0) {
        pcVar17 = "value error(%d).\n";
        uVar18 = 0x189;
LAB_0018dfc5:
        _mpp_log_l(4,"h264d_slice",pcVar17,(char *)0x0,uVar18);
      }
    }
  }
LAB_0018dfcc:
  if (MVar11 < MPP_OK) {
    if (((byte)h264d_debug & 4) == 0) {
      return MVar11;
    }
    uVar18 = 0x1e7;
  }
  else {
    MVar11 = mpp_read_bits(bitctx,currSlice->active_sps->log2_max_frame_num_minus4 + 4,
                           (RK_S32 *)&_out);
    (phVar6->bitctx).ret = MVar11;
    if (MVar11 != MPP_OK) goto LAB_0018db51;
    pRVar1 = &phVar7->recovery;
    currSlice->frame_num = _out;
    if (pRVar1->valid_flag != 0) {
      if ((phVar7->recovery).first_frm_valid == 0) {
        iVar3 = currSlice->frame_num;
        (phVar7->recovery).first_frm_id = iVar3;
        (phVar7->recovery).first_frm_valid = 1;
        (phVar7->recovery).recovery_pic_id = (phVar7->recovery).recovery_frame_cnt + iVar3;
        if ((h264d_debug._1_1_ & 0x40) != 0) {
          _mpp_log_l(4,"h264d_slice","First recovery frame found, frame_num %d",(char *)0x0);
        }
      }
      else if ((phVar7->recovery).recovery_pic_id % phVar7->max_frame_num < currSlice->frame_num) {
        pRVar1->valid_flag = 0;
        pRVar1->recovery_frame_cnt = 0;
        (phVar7->recovery).first_frm_id = 0;
        (phVar7->recovery).first_frm_valid = 0;
        (phVar7->recovery).recovery_pic_id = 0;
      }
    }
    if (currSlice->active_sps->frame_mbs_only_flag == 0) {
      MVar11 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      (phVar6->bitctx).ret = MVar11;
      if (MVar11 != MPP_OK) goto LAB_0018db51;
      currSlice->field_pic_flag = _out;
      if (_out == 0) {
        phVar7->structure = 3;
        currSlice->bottom_field_flag = 0;
      }
      else {
        MVar11 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
        (phVar6->bitctx).ret = MVar11;
        if (MVar11 != MPP_OK) goto LAB_0018db51;
        currSlice->bottom_field_flag = _out;
        phVar7->structure = 2 - (uint)(_out == 0);
      }
    }
    else {
      phVar7->structure = 3;
      currSlice->field_pic_flag = 0;
      currSlice->bottom_field_flag = 0;
    }
    currSlice->structure = phVar7->structure;
    if (currSlice->active_sps->mb_adaptive_frame_field_flag == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = (uint)(currSlice->field_pic_flag == 0);
    }
    currSlice->mb_aff_frame_flag = uVar14;
    if ((currSlice->idr_flag != 0) ||
       ((currSlice->svc_extension_flag == 0 && ((currSlice->mvcExt).non_idr_flag == 0)))) {
      MVar11 = mpp_read_ue(bitctx,&_out);
      (phVar6->bitctx).ret = MVar11;
      if (MVar11 != MPP_OK) goto LAB_0018db51;
      currSlice->idr_pic_id = _out;
    }
    iVar3 = (phVar6->bitctx).used_bits;
    RVar10 = (phVar6->bitctx).emulation_prevention_bytes_;
    if (currSlice->active_sps->pic_order_cnt_type == 0) {
      MVar11 = mpp_read_bits(bitctx,currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4,
                             (RK_S32 *)&_out);
      (phVar6->bitctx).ret = MVar11;
      if (MVar11 != MPP_OK) goto LAB_0018db51;
      currSlice->pic_order_cnt_lsb = _out;
      if ((currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1) &&
         (currSlice->field_pic_flag == 0)) {
        MVar11 = mpp_read_se(bitctx,(RK_S32 *)&_out);
        (phVar6->bitctx).ret = MVar11;
        if (MVar11 != MPP_OK) goto LAB_0018db51;
        currSlice->delta_pic_order_cnt_bottom = _out;
      }
      else {
        currSlice->delta_pic_order_cnt_bottom = 0;
      }
    }
    if (currSlice->active_sps->pic_order_cnt_type == 1) {
      if (currSlice->active_sps->delta_pic_order_always_zero_flag == 0) {
        MVar11 = mpp_read_se(bitctx,(RK_S32 *)&_out);
        (phVar6->bitctx).ret = MVar11;
        if (MVar11 != MPP_OK) goto LAB_0018db51;
        currSlice->delta_pic_order_cnt[0] = _out;
        if ((currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1) &&
           (currSlice->field_pic_flag == 0)) {
          MVar11 = mpp_read_se(bitctx,(RK_S32 *)&_out);
          (phVar6->bitctx).ret = MVar11;
          if (MVar11 != MPP_OK) goto LAB_0018db51;
          currSlice->delta_pic_order_cnt[1] = _out;
        }
        else {
          currSlice->delta_pic_order_cnt[1] = 0;
        }
      }
      else {
        currSlice->delta_pic_order_cnt[0] = 0;
        currSlice->delta_pic_order_cnt[1] = 0;
      }
    }
    currSlice->poc_used_bitlen =
         ((phVar6->bitctx).used_bits - iVar3) +
         ((int)RVar10 - (int)(phVar6->bitctx).emulation_prevention_bytes_) * 8;
    if (((((byte)h264d_debug & 2) != 0) &&
        (currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag != 0)) &&
       (_mpp_log_l(2,"h264d_slice","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0",
                   "process_slice",0x22d), (mpp_debug._3_1_ & 0x10) != 0)) {
      abort();
    }
    if (currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag != 0) {
      MVar11 = mpp_read_ue(bitctx,&_out);
      (phVar6->bitctx).ret = MVar11;
      if (MVar11 != MPP_OK) goto LAB_0018db51;
      currSlice->redundant_pic_cnt = _out;
    }
    if (currSlice->slice_type == 1) {
      MVar11 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      (phVar6->bitctx).ret = MVar11;
      if (MVar11 != MPP_OK) goto LAB_0018db51;
      currSlice->direct_spatial_mv_pred_flag = _out;
    }
    else {
      currSlice->direct_spatial_mv_pred_flag = 0;
    }
    phVar9 = currSlice->p_Vid->active_pps;
    currSlice->num_ref_idx_active[0] = phVar9->num_ref_idx_l0_default_active_minus1 + 1;
    currSlice->num_ref_idx_active[1] = phVar9->num_ref_idx_l1_default_active_minus1 + 1;
    if (((uint)currSlice->slice_type < 4) && (currSlice->slice_type != 2)) {
      MVar11 = mpp_read_bits(bitctx,1,(RK_S32 *)&_out);
      (phVar6->bitctx).ret = MVar11;
      if (MVar11 != MPP_OK) {
LAB_0018db51:
        return (phVar6->bitctx).ret;
      }
      currSlice->num_ref_idx_override_flag = _out;
      if (_out != 0) {
        MVar11 = mpp_read_ue(bitctx,&_out);
        (phVar6->bitctx).ret = MVar11;
        if (MVar11 != MPP_OK) goto LAB_0018db51;
        currSlice->num_ref_idx_active[0] = _out;
        currSlice->num_ref_idx_active[0] = _out + 1;
        if (currSlice->slice_type == 1) {
          MVar11 = mpp_read_ue(bitctx,&_out);
          (phVar6->bitctx).ret = MVar11;
          if (MVar11 != MPP_OK) goto LAB_0018db51;
          currSlice->num_ref_idx_active[1] = _out;
          currSlice->num_ref_idx_active[1] = _out + 1;
        }
      }
    }
    if (currSlice->slice_type != 1) {
      currSlice->num_ref_idx_active[1] = 0;
    }
    MVar11 = ref_pic_list_mvc_modification(currSlice);
    if (MVar11 < MPP_OK) {
      if (((byte)h264d_debug & 4) == 0) {
        return MVar11;
      }
      uVar18 = 0x249;
    }
    else {
      phVar9 = currSlice->p_Vid->active_pps;
      if ((((phVar9->weighted_pred_flag == 0) ||
           ((currSlice->slice_type != 0 && (currSlice->slice_type != 3)))) &&
          ((phVar9->weighted_bipred_idc != 1 || (currSlice->slice_type != 1)))) ||
         (MVar11 = pred_weight_table(currSlice), MPP_NOK < MVar11)) {
        currSlice->drpm_used_bitlen = 0;
        if ((currSlice->nal_reference_idc == 0) ||
           (MVar11 = dec_ref_pic_marking(currSlice), MPP_NOK < MVar11)) {
          if (((byte)h264d_debug & 0x20) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"h264d_slice",
                     "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d"
                     ,(char *)0x0,(ulong)(uint)currSlice->slice_type,
                     (ulong)(uint)currSlice->layer_id,
                     (ulong)currSlice->active_sps->seq_parameter_set_id,
                     (ulong)currSlice->active_pps->pic_parameter_set_id,
                     (ulong)(uint)currSlice->structure,(ulong)(uint)currSlice->frame_num);
          return MPP_OK;
        }
        if (((byte)h264d_debug & 4) == 0) {
          return MVar11;
        }
        uVar18 = 0x251;
      }
      else {
        if (((byte)h264d_debug & 4) == 0) {
          return MVar11;
        }
        uVar18 = 0x24d;
      }
    }
  }
  _mpp_log_l(4,"h264d_slice","Function error(%d).\n",(char *)0x0,uVar18);
  return MVar11;
}

Assistant:

MPP_RET process_slice(H264_SLICE_t *currSlice)
{
    RK_U32 temp = 0;
    RK_U32 poc_used_bits = 0;
    RK_U32 emulation_prevention = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dCurCtx_t *p_Cur = currSlice->p_Cur;
    BitReadCtx_t *p_bitctx = &p_Cur->bitctx;
    RecoveryPoint *recovery = &p_Vid->recovery;

    //!< initial value
    currSlice->p_Dpb_layer[0] = p_Vid->p_Dpb_layer[0];
    currSlice->p_Dpb_layer[1] = p_Vid->p_Dpb_layer[1];

    //!< read slice head syntax
    READ_UE(p_bitctx, &currSlice->start_mb_nr); //!< first_mb_in_slice
    READ_UE(p_bitctx, &temp); //!< slice_type
    p_Vid->slice_type = currSlice->slice_type = temp % 5;
    if (p_Vid->slice_type == H264_SP_SLICE || p_Vid->slice_type == H264_SI_SLICE) {
        H264D_WARNNING("sp or si slice not support\n");
        goto __FAILED;
    }
    READ_UE(p_bitctx, &currSlice->pic_parameter_set_id);
    init_slice_parmeters(currSlice);
    FUN_CHECK(ret = set_slice_user_parmeters(currSlice));
    //!< read rest slice header syntax
    {
        READ_BITS(p_bitctx, currSlice->active_sps->log2_max_frame_num_minus4 + 4, &currSlice->frame_num);

        if (recovery->valid_flag) {
            if (!recovery->first_frm_valid) {
                recovery->first_frm_id = currSlice->frame_num;
                recovery->first_frm_valid = 1;
                recovery->recovery_pic_id = recovery->first_frm_id + recovery->recovery_frame_cnt;
                H264D_DBG(H264D_DBG_SEI, "First recovery frame found, frame_num %d", currSlice->frame_num);
            } else {
                // It may be too early to reset recovery point info when frame_num is wrapped
                if (recovery->recovery_pic_id % p_Vid->max_frame_num < currSlice->frame_num)
                    memset(&p_Vid->recovery, 0, sizeof(RecoveryPoint));
            }
        }

        if (currSlice->active_sps->frame_mbs_only_flag) { //!< user in_slice info
            p_Vid->structure = FRAME;
            currSlice->field_pic_flag = 0;
            currSlice->bottom_field_flag = 0;
        } else {
            READ_ONEBIT(p_bitctx, &currSlice->field_pic_flag);
            if (currSlice->field_pic_flag) {
                READ_ONEBIT(p_bitctx, &currSlice->bottom_field_flag);
                p_Vid->structure = currSlice->bottom_field_flag ? BOTTOM_FIELD : TOP_FIELD;
            } else {
                p_Vid->structure = FRAME;
                currSlice->bottom_field_flag = 0;
            }
        }
        currSlice->structure = p_Vid->structure;
        currSlice->mb_aff_frame_flag = currSlice->active_sps->mb_adaptive_frame_field_flag &&
                                       !currSlice->field_pic_flag;
        if (currSlice->idr_flag) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        } else if (currSlice->svc_extension_flag == 0 && currSlice->mvcExt.non_idr_flag == 0) {
            READ_UE(p_bitctx, &currSlice->idr_pic_id);
        }
        poc_used_bits = p_bitctx->used_bits; //!< init poc used bits
        emulation_prevention = p_bitctx->emulation_prevention_bytes_;
        if (currSlice->active_sps->pic_order_cnt_type == 0) {
            READ_BITS(p_bitctx, currSlice->active_sps->log2_max_pic_order_cnt_lsb_minus4 + 4, &currSlice->pic_order_cnt_lsb);
            if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1
                && !currSlice->field_pic_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt_bottom);
            } else {
                currSlice->delta_pic_order_cnt_bottom = 0;
            }
        }
        if (currSlice->active_sps->pic_order_cnt_type == 1) {
            if (!currSlice->active_sps->delta_pic_order_always_zero_flag) {
                READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[0]);

                if (currSlice->p_Vid->active_pps->bottom_field_pic_order_in_frame_present_flag == 1 && !currSlice->field_pic_flag) {
                    READ_SE(p_bitctx, &currSlice->delta_pic_order_cnt[1]);
                } else {
                    currSlice->delta_pic_order_cnt[1] = 0;  //!< set to zero if not in stream
                }
            } else {
                currSlice->delta_pic_order_cnt[0] = 0;
                currSlice->delta_pic_order_cnt[1] = 0;
            }
        }

        // need to minus emulation prevention bytes(0x000003) we met
        emulation_prevention = p_bitctx->emulation_prevention_bytes_ - emulation_prevention;
        currSlice->poc_used_bitlen = p_bitctx->used_bits - poc_used_bits - (emulation_prevention * 8); //!< calculate poc used bit length
        //!< redundant_pic_cnt is missing here
        ASSERT(currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag == 0); // add by dw, high 4:2:2 profile not support
        if (currSlice->p_Vid->active_pps->redundant_pic_cnt_present_flag) {
            READ_UE(p_bitctx, &currSlice->redundant_pic_cnt);
        }

        if (currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->direct_spatial_mv_pred_flag);
        } else {
            currSlice->direct_spatial_mv_pred_flag = 0;
        }
        currSlice->num_ref_idx_active[LIST_0] = currSlice->p_Vid->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
        currSlice->num_ref_idx_active[LIST_1] = currSlice->p_Vid->active_pps->num_ref_idx_l1_default_active_minus1 + 1;

        if (currSlice->slice_type == H264_P_SLICE
            || currSlice->slice_type == H264_SP_SLICE || currSlice->slice_type == H264_B_SLICE) {
            READ_ONEBIT(p_bitctx, &currSlice->num_ref_idx_override_flag);
            if (currSlice->num_ref_idx_override_flag) {
                READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_0]);
                currSlice->num_ref_idx_active[LIST_0] += 1;
                if (currSlice->slice_type == H264_B_SLICE) {
                    READ_UE(p_bitctx, &currSlice->num_ref_idx_active[LIST_1]);
                    currSlice->num_ref_idx_active[LIST_1] += 1;
                }
            }
        }
        if (currSlice->slice_type != H264_B_SLICE) {
            currSlice->num_ref_idx_active[LIST_1] = 0;
        }
        FUN_CHECK(ret = ref_pic_list_mvc_modification(currSlice));
        if ((currSlice->p_Vid->active_pps->weighted_pred_flag
             && (currSlice->slice_type == H264_P_SLICE || currSlice->slice_type == H264_SP_SLICE))
            || (currSlice->p_Vid->active_pps->weighted_bipred_idc == 1 && (currSlice->slice_type == H264_B_SLICE))) {
            FUN_CHECK(ret = pred_weight_table(currSlice));
        }
        currSlice->drpm_used_bitlen = 0;
        if (currSlice->nal_reference_idc) {
            FUN_CHECK(ret = dec_ref_pic_marking(currSlice));
        }
        H264D_DBG(H264D_DBG_PPS_SPS, "[SLICE_HEAD] type=%d, layer_id=%d,sps_id=%d, pps_id=%d, struct=%d, frame_num=%d",
                  currSlice->slice_type, currSlice->layer_id, currSlice->active_sps->seq_parameter_set_id,
                  currSlice->active_pps->pic_parameter_set_id, currSlice->structure, currSlice->frame_num);
    }

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;
__FAILED:
    return ret;
}